

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls,U32 hasStep)

{
  uint *ilimit_w;
  BYTE *iStart;
  uint *iEnd;
  uint *puVar1;
  undefined8 *puVar2;
  U32 h;
  uint uVar3;
  BYTE *pBVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  seqDef *psVar7;
  int iVar8;
  uint uVar9;
  undefined8 uVar10;
  int iVar11;
  uint *puVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  size_t sVar16;
  byte bVar17;
  byte bVar18;
  uint *puVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  BYTE *pBVar23;
  ulong uVar24;
  uint *puVar25;
  BYTE *pBVar26;
  uint uVar27;
  long *p;
  uint uVar28;
  uint uVar29;
  U32 UVar30;
  uint *puVar31;
  uint *p_00;
  int iVar32;
  uint *iend;
  ulong uVar33;
  uint *ip;
  uint local_120;
  uint local_11c;
  uint *local_118;
  ulong local_e0;
  uint *local_d8;
  ulong local_60;
  
  uVar14 = (ms->cParams).targetLength;
  uVar15 = (ulong)(uVar14 + 1 + (uint)(uVar14 == 0));
  pBVar4 = (ms->window).base;
  iVar11 = (int)pBVar4;
  iVar8 = (int)src - iVar11;
  iVar32 = (int)srcSize + iVar8;
  uVar28 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar14 = (ms->window).lowLimit;
  uVar9 = iVar32 - uVar28;
  if (iVar32 - uVar14 <= uVar28) {
    uVar9 = uVar14;
  }
  if (ms->loadedDictEnd != 0) {
    uVar9 = uVar14;
  }
  uVar14 = (ms->window).dictLimit;
  if (uVar14 <= uVar9) {
    sVar16 = ZSTD_compressBlock_fast(ms,seqStore,rep,src,srcSize);
    return sVar16;
  }
  pUVar5 = ms->hashTable;
  h = (ms->cParams).hashLog;
  pBVar6 = (ms->window).dictBase;
  iStart = pBVar4 + uVar14;
  puVar19 = (uint *)(pBVar6 + uVar14);
  iEnd = (uint *)((long)src + srcSize);
  puVar1 = (uint *)((long)src + (srcSize - 8));
  uVar28 = *rep;
  uVar3 = rep[1];
  uVar13 = iVar8 - uVar9;
  if (uVar3 < uVar13) {
    local_11c = uVar3;
    uVar3 = 0;
  }
  else {
    local_11c = 0;
  }
  if (uVar28 < uVar13) {
    local_120 = uVar28;
    uVar28 = 0;
  }
  else {
    local_120 = 0;
  }
  bVar17 = 0x40 - (char)h;
  bVar18 = 0x20 - (char)h;
  ilimit_w = iEnd + -8;
  ip = (uint *)src;
  do {
    do {
      puVar31 = (uint *)((long)ip + uVar15 + 1);
      if (puVar1 <= puVar31) {
LAB_00187f0c:
        uVar14 = uVar28;
        if (local_120 == 0) {
          local_120 = uVar28;
          uVar14 = uVar3;
        }
        if (uVar28 == 0) {
          uVar14 = uVar3;
        }
        if (local_11c != 0) {
          uVar14 = local_11c;
        }
        *rep = local_120;
        rep[1] = uVar14;
        return (long)iEnd - (long)ip;
      }
      if (0x20 < h) {
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      local_d8 = (uint *)((long)ip + 1);
      uVar21 = (ulong)(mls - 5);
      switch(uVar21) {
      case 0:
        local_60 = (ulong)(*(long *)ip * -0x30e4432345000000) >> (bVar17 & 0x3f);
        local_e0 = (ulong)(*(long *)((long)ip + 1) * -0x30e4432345000000) >> (bVar17 & 0x3f);
        break;
      case 1:
        local_60 = ZSTD_hash6Ptr(ip,h);
        local_e0 = ZSTD_hash6Ptr(local_d8,h);
        break;
      case 2:
        local_60 = (ulong)(*(long *)ip * -0x30e44323405a9d00) >> (bVar17 & 0x3f);
        local_e0 = (ulong)(*(long *)((long)ip + 1) * -0x30e44323405a9d00) >> (bVar17 & 0x3f);
        break;
      case 3:
        local_60 = ZSTD_hash8Ptr(ip,h);
        local_e0 = ZSTD_hash8Ptr(local_d8,h);
        break;
      default:
        local_60 = (ulong)(*ip * -0x61c8864f >> (bVar18 & 0x1f));
        local_e0 = (ulong)((uint)(*(int *)((long)ip + 1) * -0x61c8864f) >> (bVar18 & 0x1f));
      }
      puVar25 = ip + 0x20;
      uVar33 = (ulong)pUVar5[local_60];
      puVar12 = (uint *)((long)ip + uVar15);
      pBVar23 = pBVar4;
      iend = ip;
      uVar24 = uVar15;
      if (pUVar5[local_60] < uVar14) {
        pBVar23 = pBVar6;
      }
      while( true ) {
        p_00 = puVar31;
        local_118 = puVar12;
        uVar13 = ((int)local_118 - iVar11) - local_120;
        pBVar26 = pBVar4;
        if (uVar13 < uVar14) {
          pBVar26 = pBVar6;
        }
        if ((local_120 == 0) || (uVar14 - uVar13 < 4)) {
          uVar27 = *local_118 ^ 1;
        }
        else {
          uVar27 = *(uint *)(pBVar26 + uVar13);
        }
        uVar29 = (int)iend - iVar11;
        pUVar5[local_60] = uVar29;
        puVar31 = iEnd;
        if (*local_118 == uVar27) {
          pBVar26 = pBVar26 + uVar13;
          if ((pBVar26 == iStart) || (pBVar26 == pBVar6 + uVar9)) {
            __assert_fail("(match0 != prefixStart) & (match0 != dictStart)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x72c6,
                          "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                         );
          }
          if (uVar13 < uVar14) {
            puVar31 = puVar19;
          }
          uVar24 = (ulong)(*(BYTE *)((long)local_118 + -1) == pBVar26[-1]);
          iend = (uint *)((long)local_118 - uVar24);
          pBVar23 = pBVar26 + -uVar24;
          uVar24 = uVar24 | 4;
          UVar30 = 1;
          goto LAB_001879ba;
        }
        if ((uVar9 <= (uint)uVar33) && (*iend == *(uint *)(pBVar23 + uVar33))) break;
        uVar13 = pUVar5[local_e0];
        uVar33 = (ulong)uVar13;
        pBVar23 = pBVar4;
        if (uVar13 < uVar14) {
          pBVar23 = pBVar6;
        }
        switch(uVar21) {
        case 0:
          local_60 = *(long *)local_118 * -0x30e4432345000000;
          goto LAB_00187746;
        case 1:
          local_60 = ZSTD_hash6Ptr(local_118,h);
          break;
        case 2:
          local_60 = *(long *)local_118 * -0x30e44323405a9d00;
LAB_00187746:
          local_60 = local_60 >> (bVar17 & 0x3f);
          break;
        case 3:
          local_60 = ZSTD_hash8Ptr(local_118,h);
          break;
        default:
          local_60 = (ulong)(*local_118 * -0x61c8864f >> (bVar18 & 0x1f));
        }
        uVar29 = (int)local_d8 - iVar11;
        pUVar5[local_e0] = uVar29;
        if ((uVar9 <= uVar13) && (iend = local_d8, *local_d8 == *(uint *)(pBVar23 + uVar33)))
        goto LAB_0018793b;
        uVar33 = (ulong)pUVar5[local_60];
        pBVar23 = pBVar4;
        if (pUVar5[local_60] < uVar14) {
          pBVar23 = pBVar6;
        }
        switch(uVar21) {
        case 0:
          local_e0 = *(long *)p_00 * -0x30e4432345000000;
          goto LAB_00187824;
        case 1:
          local_e0 = ZSTD_hash6Ptr(p_00,h);
          break;
        case 2:
          local_e0 = *(long *)p_00 * -0x30e44323405a9d00;
LAB_00187824:
          local_e0 = local_e0 >> (bVar17 & 0x3f);
          break;
        case 3:
          local_e0 = ZSTD_hash8Ptr(p_00,h);
          break;
        default:
          local_e0 = (ulong)(*p_00 * -0x61c8864f >> (bVar18 & 0x1f));
        }
        uVar20 = uVar24;
        if (puVar25 <= (uint *)((long)local_118 + uVar24)) {
          puVar25 = puVar25 + 0x20;
          uVar20 = uVar24 + 1;
        }
        puVar31 = (uint *)(uVar24 + (long)p_00);
        puVar12 = (uint *)((long)local_118 + uVar24);
        iend = local_118;
        uVar24 = uVar20;
        local_d8 = p_00;
        if (puVar1 <= puVar31) goto LAB_00187f0c;
      }
      local_118 = local_d8;
      local_60 = local_e0;
LAB_0018793b:
      pBVar26 = iStart;
      if ((uint)uVar33 < uVar14) {
        puVar31 = puVar19;
        pBVar26 = pBVar6 + uVar9;
      }
      uVar13 = uVar29 - (uint)uVar33;
      if (uVar13 == 0) {
        __assert_fail("(offset)>0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7326,
                      "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                     );
      }
      pBVar23 = pBVar23 + uVar33;
      UVar30 = uVar13 + 3;
      uVar24 = 4;
      for (; ((pBVar26 < pBVar23 && (ip < iend)) && (*(BYTE *)((long)iend + -1) == pBVar23[-1]));
          iend = (uint *)((long)iend + -1)) {
        pBVar23 = pBVar23 + -1;
        uVar24 = uVar24 + 1;
      }
      local_d8 = local_118;
      local_11c = local_120;
      local_e0 = local_60;
      local_120 = uVar13;
LAB_001879ba:
      if (puVar31 == (uint *)0x0) {
        __assert_fail("matchEnd != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7333,
                      "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                     );
      }
      sVar16 = ZSTD_count_2segments
                         ((BYTE *)((long)iend + uVar24),pBVar23 + uVar24,(BYTE *)iEnd,
                          (BYTE *)puVar31,iStart);
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_00187f62:
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
LAB_00187f81:
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar33 = (long)iend - (long)ip;
      pBVar23 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar23 + uVar33) {
LAB_00187fde:
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468e,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (iEnd < iend) {
LAB_00187fbf:
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (ilimit_w < iend) {
        ZSTD_safecopyLiterals(pBVar23,(BYTE *)ip,(BYTE *)iend,(BYTE *)ilimit_w);
LAB_00187a5d:
        seqStore->lit = seqStore->lit + uVar33;
        if (0xffff < uVar33) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        uVar10 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar23 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar23 + 8) = uVar10;
        pBVar23 = seqStore->lit;
        if (0x10 < uVar33) {
          if ((BYTE *)0xffffffffffffffe0 < pBVar23 + 0x10 + (-0x10 - (long)(ip + 4))) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x36a6,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar10 = *(undefined8 *)(ip + 6);
          *(undefined8 *)(pBVar23 + 0x10) = *(undefined8 *)(ip + 4);
          *(undefined8 *)(pBVar23 + 0x18) = uVar10;
          if (0x20 < (long)uVar33) {
            lVar22 = 0;
            do {
              puVar2 = (undefined8 *)((long)ip + lVar22 + 0x20);
              uVar10 = puVar2[1];
              pBVar26 = pBVar23 + lVar22 + 0x20;
              *(undefined8 *)pBVar26 = *puVar2;
              *(undefined8 *)(pBVar26 + 8) = uVar10;
              puVar2 = (undefined8 *)((long)ip + lVar22 + 0x30);
              uVar10 = puVar2[1];
              *(undefined8 *)(pBVar26 + 0x10) = *puVar2;
              *(undefined8 *)(pBVar26 + 0x18) = uVar10;
              lVar22 = lVar22 + 0x20;
            } while (pBVar26 + 0x20 < pBVar23 + uVar33);
          }
          goto LAB_00187a5d;
        }
        seqStore->lit = pBVar23 + uVar33;
      }
      uVar24 = sVar16 + uVar24;
      psVar7 = seqStore->sequences;
      psVar7->litLength = (U16)uVar33;
      psVar7->offBase = UVar30;
      if (uVar24 < 3) {
LAB_00187fa0:
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46aa,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0xffff < uVar24 - 3) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_00187ffd:
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46ad,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar7->mlBase = (U16)(uVar24 - 3);
      seqStore->sequences = psVar7 + 1;
      ip = (uint *)((long)iend + uVar24);
      if (local_d8 < ip) {
        pUVar5[local_e0] = (int)local_d8 - iVar11;
      }
    } while (puVar1 < ip);
    p = (long *)(pBVar4 + (ulong)uVar29 + 2);
    if (p <= src) {
      __assert_fail("base+current0+2 > istart",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7343,
                    "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    UVar30 = uVar29 + 2;
    switch(uVar21) {
    case 0:
      pUVar5[(ulong)(*p * -0x30e4432345000000) >> (bVar17 & 0x3f)] = UVar30;
      uVar24 = *(long *)((long)ip + -2) * -0x30e4432345000000;
      goto LAB_00187c42;
    case 1:
      sVar16 = ZSTD_hash6Ptr(p,h);
      pUVar5[sVar16] = UVar30;
      uVar24 = ZSTD_hash6Ptr((void *)((long)ip + -2),h);
      break;
    case 2:
      pUVar5[(ulong)(*p * -0x30e44323405a9d00) >> (bVar17 & 0x3f)] = UVar30;
      uVar24 = *(long *)((long)ip + -2) * -0x30e44323405a9d00;
LAB_00187c42:
      uVar24 = uVar24 >> (bVar17 & 0x3f);
      break;
    case 3:
      sVar16 = ZSTD_hash8Ptr(p,h);
      pUVar5[sVar16] = UVar30;
      uVar24 = ZSTD_hash8Ptr((void *)((long)ip + -2),h);
      break;
    default:
      pUVar5[(uint)((int)*p * -0x61c8864f) >> (bVar18 & 0x1f)] = UVar30;
      uVar24 = (ulong)((uint)(*(int *)((long)ip + -2) * -0x61c8864f) >> (bVar18 & 0x1f));
    }
    pUVar5[uVar24] = ((int)ip + -2) - iVar11;
    uVar13 = local_120;
    for (; local_120 = uVar13, ip <= puVar1; ip = (uint *)((long)ip + sVar16 + 4)) {
      UVar30 = (int)ip - iVar11;
      uVar13 = UVar30 - local_11c;
      pBVar23 = pBVar4;
      if (uVar13 < uVar14) {
        pBVar23 = pBVar6;
      }
      if (((local_11c == 0) || (0xfffffffc < uVar13 - uVar14)) ||
         (*(uint *)(pBVar23 + uVar13) != *ip)) break;
      puVar31 = iEnd;
      if (uVar13 < uVar14) {
        puVar31 = puVar19;
      }
      sVar16 = ZSTD_count_2segments
                         ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar23 + uVar13) + 4),(BYTE *)iEnd,
                          (BYTE *)puVar31,iStart);
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_00187f62;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00187f81;
      puVar31 = (uint *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar31) goto LAB_00187fde;
      if (iEnd < ip) goto LAB_00187fbf;
      if (ilimit_w < ip) {
        ZSTD_safecopyLiterals((BYTE *)puVar31,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
      }
      else {
        uVar13 = ip[1];
        uVar27 = ip[2];
        uVar29 = ip[3];
        *puVar31 = *ip;
        puVar31[1] = uVar13;
        puVar31[2] = uVar27;
        puVar31[3] = uVar29;
      }
      psVar7 = seqStore->sequences;
      psVar7->litLength = 0;
      psVar7->offBase = 1;
      if (sVar16 + 4 < 3) goto LAB_00187fa0;
      if (0xffff < sVar16 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00187ffd;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar7->mlBase = (U16)(sVar16 + 1);
      seqStore->sequences = psVar7 + 1;
      if (mls - 5 < 4) {
        sVar16 = (*(code *)(&DAT_0024f40c + *(int *)(&DAT_0024f40c + uVar21 * 4)))();
        return sVar16;
      }
      pUVar5[*ip * -0x61c8864f >> (bVar18 & 0x1f)] = UVar30;
      uVar13 = local_11c;
      local_11c = local_120;
    }
  } while( true );
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls, U32 const hasStep)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    size_t const stepSize = cParams->targetLength + !(cParams->targetLength) + 1;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* anchor = istart;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = dictLimit < lowLimit ? lowLimit : dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];
    U32 offsetSaved1 = 0, offsetSaved2 = 0;

    const BYTE* ip0 = istart;
    const BYTE* ip1;
    const BYTE* ip2;
    const BYTE* ip3;
    U32 current0;


    size_t hash0; /* hash for ip0 */
    size_t hash1; /* hash for ip1 */
    U32 idx; /* match idx for ip0 */
    const BYTE* idxBase; /* base pointer for idx */

    U32 offcode;
    const BYTE* match0;
    size_t mLength;
    const BYTE* matchEnd = 0; /* initialize to avoid warning, assert != 0 later */

    size_t step;
    const BYTE* nextStep;
    const size_t kStepIncr = (1 << (kSearchStrength - 1));

    (void)hasStep; /* not currently specialized on whether it's accelerated */

    DEBUGLOG(5, "ZSTD_compressBlock_fast_extDict_generic (offset_1=%u)", offset_1);

    /* switch to "regular" variant if extDict is invalidated due to maxDistance */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_fast(ms, seqStore, rep, src, srcSize);

    {   U32 const curr = (U32)(ip0 - base);
        U32 const maxRep = curr - dictStartIndex;
        if (offset_2 >= maxRep) offsetSaved2 = offset_2, offset_2 = 0;
        if (offset_1 >= maxRep) offsetSaved1 = offset_1, offset_1 = 0;
    }

    /* start each op */
_start: /* Requires: ip0 */

    step = stepSize;
    nextStep = ip0 + kStepIncr;

    /* calculate positions, ip0 - anchor == 0, so we skip step calc */
    ip1 = ip0 + 1;
    ip2 = ip0 + step;
    ip3 = ip2 + 1;

    if (ip3 >= ilimit) {
        goto _cleanup;
    }

    hash0 = ZSTD_hashPtr(ip0, hlog, mls);
    hash1 = ZSTD_hashPtr(ip1, hlog, mls);

    idx = hashTable[hash0];
    idxBase = idx < prefixStartIndex ? dictBase : base;

    do {
        {   /* load repcode match for ip[2] */
            U32 const current2 = (U32)(ip2 - base);
            U32 const repIndex = current2 - offset_1;
            const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
            U32 rval;
            if ( ((U32)(prefixStartIndex - repIndex) >= 4) /* intentional underflow */
                 & (offset_1 > 0) ) {
                rval = MEM_read32(repBase + repIndex);
            } else {
                rval = MEM_read32(ip2) ^ 1; /* guaranteed to not match. */
            }

            /* write back hash table entry */
            current0 = (U32)(ip0 - base);
            hashTable[hash0] = current0;

            /* check repcode at ip[2] */
            if (MEM_read32(ip2) == rval) {
                ip0 = ip2;
                match0 = repBase + repIndex;
                matchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
                assert((match0 != prefixStart) & (match0 != dictStart));
                mLength = ip0[-1] == match0[-1];
                ip0 -= mLength;
                match0 -= mLength;
                offcode = REPCODE1_TO_OFFBASE;
                mLength += 4;
                goto _match;
        }   }

        {   /* load match for ip[0] */
            U32 const mval = idx >= dictStartIndex ?
                    MEM_read32(idxBase + idx) :
                    MEM_read32(ip0) ^ 1; /* guaranteed not to match */

            /* check match at ip[0] */
            if (MEM_read32(ip0) == mval) {
                /* found a match! */
                goto _offset;
        }   }

        /* lookup ip[1] */
        idx = hashTable[hash1];
        idxBase = idx < prefixStartIndex ? dictBase : base;

        /* hash ip[2] */
        hash0 = hash1;
        hash1 = ZSTD_hashPtr(ip2, hlog, mls);

        /* advance to next positions */
        ip0 = ip1;
        ip1 = ip2;
        ip2 = ip3;

        /* write back hash table entry */
        current0 = (U32)(ip0 - base);
        hashTable[hash0] = current0;

        {   /* load match for ip[0] */
            U32 const mval = idx >= dictStartIndex ?
                    MEM_read32(idxBase + idx) :
                    MEM_read32(ip0) ^ 1; /* guaranteed not to match */

            /* check match at ip[0] */
            if (MEM_read32(ip0) == mval) {
                /* found a match! */
                goto _offset;
        }   }

        /* lookup ip[1] */
        idx = hashTable[hash1];
        idxBase = idx < prefixStartIndex ? dictBase : base;

        /* hash ip[2] */
        hash0 = hash1;
        hash1 = ZSTD_hashPtr(ip2, hlog, mls);

        /* advance to next positions */
        ip0 = ip1;
        ip1 = ip2;
        ip2 = ip0 + step;
        ip3 = ip1 + step;

        /* calculate step */
        if (ip2 >= nextStep) {
            step++;
            PREFETCH_L1(ip1 + 64);
            PREFETCH_L1(ip1 + 128);
            nextStep += kStepIncr;
        }
    } while (ip3 < ilimit);

_cleanup:
    /* Note that there are probably still a couple positions we could search.
     * However, it seems to be a meaningful performance hit to try to search
     * them. So let's not. */

    /* If offset_1 started invalid (offsetSaved1 != 0) and became valid (offset_1 != 0),
     * rotate saved offsets. See comment in ZSTD_compressBlock_fast_noDict for more context. */
    offsetSaved2 = ((offsetSaved1 != 0) && (offset_1 != 0)) ? offsetSaved1 : offsetSaved2;

    /* save reps for next block */
    rep[0] = offset_1 ? offset_1 : offsetSaved1;
    rep[1] = offset_2 ? offset_2 : offsetSaved2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);

_offset: /* Requires: ip0, idx, idxBase */

    /* Compute the offset code. */
    {   U32 const offset = current0 - idx;
        const BYTE* const lowMatchPtr = idx < prefixStartIndex ? dictStart : prefixStart;
        matchEnd = idx < prefixStartIndex ? dictEnd : iend;
        match0 = idxBase + idx;
        offset_2 = offset_1;
        offset_1 = offset;
        offcode = OFFSET_TO_OFFBASE(offset);
        mLength = 4;

        /* Count the backwards match length. */
        while (((ip0>anchor) & (match0>lowMatchPtr)) && (ip0[-1] == match0[-1])) {
            ip0--;
            match0--;
            mLength++;
    }   }

_match: /* Requires: ip0, match0, offcode, matchEnd */

    /* Count the forward length. */
    assert(matchEnd != 0);
    mLength += ZSTD_count_2segments(ip0 + mLength, match0 + mLength, iend, matchEnd, prefixStart);

    ZSTD_storeSeq(seqStore, (size_t)(ip0 - anchor), anchor, iend, offcode, mLength);

    ip0 += mLength;
    anchor = ip0;

    /* write next hash table entry */
    if (ip1 < ip0) {
        hashTable[hash1] = (U32)(ip1 - base);
    }

    /* Fill table and check for immediate repcode. */
    if (ip0 <= ilimit) {
        /* Fill Table */
        assert(base+current0+2 > istart);  /* check base overflow */
        hashTable[ZSTD_hashPtr(base+current0+2, hlog, mls)] = current0+2;  /* here because current+2 could be > iend-8 */
        hashTable[ZSTD_hashPtr(ip0-2, hlog, mls)] = (U32)(ip0-2-base);

        while (ip0 <= ilimit) {
            U32 const repIndex2 = (U32)(ip0-base) - offset_2;
            const BYTE* const repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
            if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (offset_2 > 0))  /* intentional underflow */
                 && (MEM_read32(repMatch2) == MEM_read32(ip0)) ) {
                const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                size_t const repLength2 = ZSTD_count_2segments(ip0+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                { U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset; }  /* swap offset_2 <=> offset_1 */
                ZSTD_storeSeq(seqStore, 0 /*litlen*/, anchor, iend, REPCODE1_TO_OFFBASE, repLength2);
                hashTable[ZSTD_hashPtr(ip0, hlog, mls)] = (U32)(ip0-base);
                ip0 += repLength2;
                anchor = ip0;
                continue;
            }
            break;
    }   }

    goto _start;
}